

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void do_ssi_exec(mg_connection *conn,char *tag)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  FILE *fp;
  char cmd [8192];
  char *tag_local;
  mg_connection *conn_local;
  
  cmd._8184_8_ = tag;
  iVar1 = __isoc99_sscanf(tag," \"%[^\"]\"",&fp);
  if (iVar1 == 1) {
    __stream = popen((char *)&fp,"r");
    if (__stream == (FILE *)0x0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      mg_printf(conn,"Cannot SSI #exec: [%s]: %s",&fp,pcVar3);
    }
    else {
      send_file_data(conn,(FILE *)__stream);
      pclose(__stream);
    }
  }
  else {
    mg_printf(conn,"Bad SSI #exec: [%s]",cmd._8184_8_);
  }
  return;
}

Assistant:

static void do_ssi_exec(struct mg_connection *conn, char *tag) {
  char cmd[IOBUF_SIZE];
  FILE *fp;

  if (sscanf(tag, " \"%[^\"]\"", cmd) != 1) {
    mg_printf(conn, "Bad SSI #exec: [%s]", tag);
  } else if ((fp = popen(cmd, "r")) == NULL) {
    mg_printf(conn, "Cannot SSI #exec: [%s]: %s", cmd, strerror(errno));
  } else {
    send_file_data(conn, fp);
    pclose(fp);
  }
}